

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

void * __thiscall
Diligent::FixedLinearAllocator::Allocate(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  ulong uVar1;
  bool bVar2;
  Char *pCVar3;
  char (*Args_1) [25];
  size_type sVar4;
  reference Args_2;
  uchar *puVar5;
  char (*in_stack_fffffffffffffe38) [2];
  undefined1 local_170 [8];
  string msg_8;
  uint8_t *ptr;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  value_type *CurrAllocation;
  string msg_2;
  size_t dbgReservedSize;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  size_t alignment_local;
  size_t size_local;
  FixedLinearAllocator *this_local;
  
  msg.field_2._8_8_ = alignment;
  alignment_local = size;
  size_local = (size_t)this;
  if ((size != 0) && (this->m_pDataStart == (uint8_t *)0x0)) {
    FormatString<char[30]>((string *)local_48,(char (*) [30])"Memory has not been allocated");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe0);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar2 = IsPowerOfTwo<unsigned_long>(msg.field_2._8_8_);
  if (!bVar2) {
    FormatString<char[33]>
              ((string *)&dbgReservedSize,(char (*) [33])"Alignment is not a power of two!");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe1);
    std::__cxx11::string::~string((string *)&dbgReservedSize);
  }
  if (alignment_local == 0) {
    this_local = (FixedLinearAllocator *)0x0;
  }
  else {
    Args_1 = (char (*) [25])AlignUp<unsigned_long,unsigned_long>(alignment_local,msg.field_2._8_8_);
    msg_2.field_2._8_8_ = 0;
    alignment_local = (size_t)Args_1;
    if ((this->m_DbgUsingExternalMemory & 1U) == 0) {
      uVar1 = this->m_DbgCurrAllocation;
      sVar4 = std::
              vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
              ::size(&this->m_DbgAllocations);
      if (sVar4 <= uVar1) {
        FormatString<char[82]>
                  ((string *)&CurrAllocation,
                   (char (*) [82])
                   "Allocation number exceed the number of allocations that were originally reserved."
                  );
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xec);
        std::__cxx11::string::~string((string *)&CurrAllocation);
      }
      sVar4 = this->m_DbgCurrAllocation;
      this->m_DbgCurrAllocation = sVar4 + 1;
      Args_2 = std::
               vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
               ::operator[](&this->m_DbgAllocations,sVar4);
      if (Args_2->size != alignment_local) {
        FormatString<char[18],unsigned_long,char[48],unsigned_long,char[2]>
                  ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Allocation size (",
                   (char (*) [18])&alignment_local,
                   (unsigned_long *)") does not match the initially requested size (",
                   (char (*) [48])Args_2,(unsigned_long *)0x46d916,in_stack_fffffffffffffe38);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xee);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
      if (Args_2->alignment != msg.field_2._8_8_) {
        FormatString<char[23],unsigned_long,char[53],unsigned_long,char[2]>
                  ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Allocation alignment (",
                   (char (*) [23])((long)&msg.field_2 + 8),
                   (unsigned_long *)") does not match the initially requested alignment (",
                   (char (*) [53])&Args_2->alignment,(unsigned_long *)0x46d916,
                   in_stack_fffffffffffffe38);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xef);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
      msg_2.field_2._8_8_ = Args_2->reserved_size;
    }
    else {
      bVar2 = std::
              vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
              ::empty(&this->m_DbgAllocations);
      if (!bVar2) {
        FormatString<char[26],char[25]>
                  ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_DbgAllocations.empty()",Args_1);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xf5);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      }
    }
    puVar5 = AlignUp<unsigned_char,unsigned_long>(this->m_pCurrPtr,this->m_CurrAlignment);
    if (puVar5 != this->m_pCurrPtr) {
      FormatString<char[43]>
                ((string *)((long)&msg_7.field_2 + 8),
                 (char (*) [43])"Current pointer is not aligned as expected");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xf9);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    puVar5 = AlignUp<unsigned_char,unsigned_long>(this->m_pCurrPtr,msg.field_2._8_8_);
    this->m_pCurrPtr = puVar5;
    this->m_CurrAlignment = msg.field_2._8_8_;
    if (((this->m_DbgUsingExternalMemory & 1U) == 0) &&
       (this->m_pDataStart + msg_2.field_2._8_8_ < this->m_pCurrPtr + alignment_local)) {
      FormatString<char[76]>
                ((string *)&ptr,
                 (char (*) [76])
                 "Allocation size exceeds the initially reserved space. This is likely a bug.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xfe);
      std::__cxx11::string::~string((string *)&ptr);
    }
    msg_8.field_2._8_8_ = this->m_pCurrPtr;
    this->m_pCurrPtr = this->m_pCurrPtr + alignment_local;
    if (this->m_pDataStart + this->m_ReservedSize < this->m_pCurrPtr) {
      FormatString<char[43]>
                ((string *)local_170,(char (*) [43])"Allocation size exceeds the reserved space");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0x103);
      std::__cxx11::string::~string((string *)local_170);
    }
    this_local = (FixedLinearAllocator *)msg_8.field_2._8_8_;
  }
  return this_local;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t alignment = 1)
    {
        VERIFY(size == 0 || m_pDataStart != nullptr, "Memory has not been allocated");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return nullptr;

        size = AlignUp(size, alignment);

#if DILIGENT_DEBUG
        size_t dbgReservedSize = 0;
        if (!m_DbgUsingExternalMemory)
        {
            VERIFY(m_DbgCurrAllocation < m_DbgAllocations.size(), "Allocation number exceed the number of allocations that were originally reserved.");
            const auto& CurrAllocation = m_DbgAllocations[m_DbgCurrAllocation++];
            VERIFY(CurrAllocation.size == size, "Allocation size (", size, ") does not match the initially requested size (", CurrAllocation.size, ")");
            VERIFY(CurrAllocation.alignment == alignment, "Allocation alignment (", alignment, ") does not match the initially requested alignment (", CurrAllocation.alignment, ")");
            dbgReservedSize = CurrAllocation.reserved_size;
        }
        else
        {
            // Allocating in place in assigned memory
            VERIFY_EXPR(m_DbgAllocations.empty());
        }
#endif

        VERIFY(AlignUp(m_pCurrPtr, m_CurrAlignment) == m_pCurrPtr, "Current pointer is not aligned as expected");
        m_pCurrPtr      = AlignUp(m_pCurrPtr, alignment);
        m_CurrAlignment = alignment;

        VERIFY(m_DbgUsingExternalMemory || m_pCurrPtr + size <= m_pDataStart + dbgReservedSize,
               "Allocation size exceeds the initially reserved space. This is likely a bug.");

        auto* ptr = m_pCurrPtr;
        m_pCurrPtr += size;

        VERIFY(m_pCurrPtr <= m_pDataStart + m_ReservedSize, "Allocation size exceeds the reserved space");

        return ptr;
    }